

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.c
# Opt level: O0

uint32_t next_power2(uint32_t v)

{
  uint uVar1;
  uint32_t v_local;
  
  uVar1 = v - 1 >> 1 | v - 1;
  uVar1 = uVar1 >> 2 | uVar1;
  uVar1 = uVar1 >> 4 | uVar1;
  uVar1 = uVar1 >> 8 | uVar1;
  return (uVar1 >> 0x10 | uVar1) + 1;
}

Assistant:

uint32_t next_power2(uint32_t v){
  v--;
  v |= v >> 1;
  v |= v >> 2;
  v |= v >> 4;
  v |= v >> 8;
  v |= v >> 16;
  v++;
  return v;
}